

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenArrayCopySetLength(BinaryenExpressionRef expr,BinaryenExpressionRef lengthExpr)

{
  if (expr->_id != ArrayCopyId) {
    __assert_fail("expression->is<ArrayCopy>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x118b,
                  "void BinaryenArrayCopySetLength(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (lengthExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 3) = lengthExpr;
    return;
  }
  __assert_fail("lengthExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x118c,
                "void BinaryenArrayCopySetLength(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenArrayCopySetLength(BinaryenExpressionRef expr,
                                BinaryenExpressionRef lengthExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayCopy>());
  assert(lengthExpr);
  static_cast<ArrayCopy*>(expression)->length = (Expression*)lengthExpr;
}